

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O1

void __thiscall
cert::Camera::Camera(Camera *this,Vec3 lookfrom,Vec3 lookat,Vec3 vup,float vfov,float aspect)

{
  float fVar1;
  double dVar2;
  double dVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  float local_28;
  float fStack_24;
  
  dVar2 = ((double)vfov * 3.141) / 180.0;
  fVar4 = (float)dVar2 * 0.5;
  *(undefined8 *)&(this->horizontal).z = 0;
  (this->vertical).y = 0.0;
  (this->vertical).z = 0.0;
  (this->upper_left_corner).y = 0.0;
  (this->upper_left_corner).z = 0.0;
  (this->horizontal).x = 0.0;
  (this->horizontal).y = 0.0;
  (this->origin).x = 0.0;
  (this->origin).y = 0.0;
  *(undefined8 *)&(this->origin).z = 0;
  dVar2 = sin((double)CONCAT44((int)((ulong)dVar2 >> 0x20),fVar4));
  dVar3 = cos((double)(ulong)(uint)fVar4);
  fVar7 = SUB84(dVar2,0) / SUB84(dVar3,0);
  fVar5 = aspect * fVar7;
  local_48 = lookfrom.x;
  fStack_44 = lookfrom.y;
  (this->origin).x = local_48;
  (this->origin).y = fStack_44;
  (this->origin).z = lookfrom.z;
  local_58 = lookat.x;
  fStack_54 = lookat.y;
  local_48 = local_48 - local_58;
  fStack_44 = fStack_44 - fStack_54;
  fVar9 = lookfrom.z - lookat.z;
  dVar2 = sqrt((double)(ulong)(uint)(fVar9 * fVar9 + local_48 * local_48 + fStack_44 * fStack_44));
  fVar4 = SUB84(dVar2,0);
  local_48 = local_48 / fVar4;
  fStack_44 = fStack_44 / fVar4;
  fVar9 = fVar9 / fVar4;
  local_28 = vup.x;
  fStack_24 = vup.y;
  fVar13 = fStack_24 * fVar9 - fStack_44 * vup.z;
  fVar10 = vup.z * local_48 - fVar9 * local_28;
  fVar12 = local_28 * fStack_44 - local_48 * fStack_24;
  dVar2 = sqrt((double)CONCAT44(fStack_24,fVar12 * fVar12 + fVar13 * fVar13 + fVar10 * fVar10));
  fVar4 = SUB84(dVar2,0);
  fVar13 = fVar13 / fVar4;
  fVar10 = fVar10 / fVar4;
  fVar12 = fVar12 / fVar4;
  fVar6 = fStack_44 * fVar12 - fVar10 * fVar9;
  fVar8 = fVar9 * fVar13 - fVar12 * local_48;
  fVar11 = local_48 * fVar10 - fVar13 * fStack_44;
  fVar4 = (this->origin).y;
  fVar1 = (this->origin).z;
  (this->upper_left_corner).x = (fVar7 * fVar6 + ((this->origin).x - fVar5 * fVar13)) - local_48;
  (this->upper_left_corner).y = (fVar7 * fVar8 + (fVar4 - fVar5 * fVar10)) - fStack_44;
  (this->upper_left_corner).z = (fVar7 * fVar11 + (fVar1 - fVar5 * fVar12)) - fVar9;
  fVar5 = fVar5 + fVar5;
  (this->horizontal).x = fVar13 * fVar5;
  (this->horizontal).y = fVar10 * fVar5;
  (this->horizontal).z = fVar5 * fVar12;
  fVar7 = fVar7 + fVar7;
  (this->vertical).x = fVar6 * fVar7;
  (this->vertical).y = fVar8 * fVar7;
  (this->vertical).z = fVar7 * fVar11;
  return;
}

Assistant:

constexpr Camera (Vec3 lookfrom, Vec3 lookat, Vec3 vup, float vfov, float aspect)
	{
		Vec3 u, v, w;
		float theta = vfov * 3.141 / 180;
		float half_height = tan (theta / 2);
		float half_width = aspect * half_height;
		origin = lookfrom;
		w = normalize (lookfrom - lookat);
		u = normalize (cross (vup, w));
		v = cross (w, u);
		upper_left_corner = origin - half_width * u + half_height * v - w;
		horizontal = 2 * half_width * u;
		vertical = 2 * half_height * v;
	}